

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalToStackPass.cpp
# Opt level: O2

void __thiscall
GlobalToStack::extractValuesFromStore
          (GlobalToStack *this,StoreInst *inst,SmallSetVector<llvm::GlobalVariable_*,_4U> *Vars)

{
  bool bVar1;
  Value *Val;
  LLVMContext *pLVar2;
  IntegerType *pIVar3;
  ValueParamT Elt;
  Value *Ptr;
  ret_type C;
  SmallVector<llvm::Value_*,_4U> Idx;
  SmallVectorImpl<llvm::Value_*> local_58;
  undefined1 local_48 [32];
  
  Val = llvm::StoreInst::getValueOperand(inst);
  bVar1 = llvm::isa_impl_cl<llvm::ConstantAggregate,_const_llvm::Value_*>::doit(Val);
  if (bVar1) {
    local_58.super_SmallVectorTemplateBase<llvm::Value_*,_true>.
    super_SmallVectorTemplateCommon<llvm::Value_*,_void>.super_SmallVectorBase<unsigned_int>.BeginX
         = local_48;
    local_58.super_SmallVectorTemplateBase<llvm::Value_*,_true>.
    super_SmallVectorTemplateCommon<llvm::Value_*,_void>.super_SmallVectorBase<unsigned_int>.Size =
         0;
    local_58.super_SmallVectorTemplateBase<llvm::Value_*,_true>.
    super_SmallVectorTemplateCommon<llvm::Value_*,_void>.super_SmallVectorBase<unsigned_int>.
    Capacity = 4;
    pLVar2 = (LLVMContext *)llvm::BasicBlock::getContext();
    pIVar3 = (IntegerType *)llvm::Type::getInt32Ty(pLVar2);
    Elt = (ValueParamT)llvm::ConstantInt::get(pIVar3,0,false);
    llvm::SmallVectorTemplateBase<llvm::Value_*,_true>::push_back
              (&local_58.super_SmallVectorTemplateBase<llvm::Value_*,_true>,Elt);
    Ptr = llvm::StoreInst::getPointerOperand(inst);
    C = llvm::cast<llvm::ConstantAggregate,llvm::Value>(Val);
    disaggregateVars(this,(Instruction *)inst,Ptr,&local_58,C,Vars);
    llvm::SmallVectorImpl<llvm::Value_*>::~SmallVectorImpl(&local_58);
  }
  return;
}

Assistant:

void GlobalToStack::extractValuesFromStore(
    StoreInst *inst, SmallSetVector<GlobalVariable *, 4> &Vars) {
  Value *V = inst->getValueOperand();
  if (!isa<ConstantAggregate>(V))
    return;

  SmallVector<Value *, 4> Idx;
  Idx.push_back(
      ConstantInt::get(Type::getInt32Ty(inst->getParent()->getContext()), 0));

  disaggregateVars(inst, inst->getPointerOperand(), Idx,
                   cast<ConstantAggregate>(*V), Vars);
}